

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZStructMatrix::SetMaterialIds
          (TPZStructMatrix *this,set<int,_std::less<int>,_std::allocator<int>_> *materialids)

{
  TPZCompMesh *pTVar1;
  long lVar2;
  TPZReference *pTVar3;
  TPZStructMatrix *this_00;
  TPZCompEl **ppTVar4;
  long lVar5;
  long nelem;
  TPZAutoPointer<TPZLinearAnalysis> analysis;
  TPZAutoPointer<TPZLinearAnalysis> local_40;
  TPZAutoPointer<TPZStructMatrix> local_38;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(this->fMaterialIds)._M_t,&materialids->_M_t);
  pTVar1 = this->fMesh;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SetMaterialIds called without mesh",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    return;
  }
  lVar2 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar2) {
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (*ppTVar4 != (TPZCompEl *)0x0) {
        lVar5 = __dynamic_cast(*ppTVar4,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
        if (lVar5 != 0) {
          local_40.fRef = *(TPZReference **)(lVar5 + 0x940);
          LOCK();
          ((local_40.fRef)->fCounter).super___atomic_base<int>._M_i =
               ((local_40.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if ((local_40.fRef == (TPZReference *)0x0) ||
             ((local_40.fRef)->fPointer == (TPZLinearAnalysis *)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "SetMaterialIds called for substructure without analysis object",0x3e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZStructMatrix.cpp"
                       ,0x5c);
          }
          pTVar3 = ((local_40.fRef)->fPointer->super_TPZAnalysis).fStructMatrix.fRef;
          if ((pTVar3 == (TPZReference *)0x0) || (pTVar3->fPointer == (TPZStructMatrix *)0x0)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZAnalysis.h"
                       ,0xc9);
          }
          LOCK();
          (pTVar3->fCounter).super___atomic_base<int>._M_i =
               (pTVar3->fCounter).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          this_00 = pTVar3->fPointer;
          local_38.fRef = pTVar3;
          TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_38);
          if (this_00 == (TPZStructMatrix *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "SetMaterialIds called for substructure without structural matrix",0x40);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          else {
            SetMaterialIds(this_00,materialids);
          }
          TPZAutoPointer<TPZLinearAnalysis>::~TPZAutoPointer(&local_40);
        }
      }
      nelem = nelem + 1;
    } while (lVar2 != nelem);
  }
  return;
}

Assistant:

void TPZStructMatrix::SetMaterialIds(const std::set<int> &materialids)
{
    fMaterialIds = materialids;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::set<int>::const_iterator it;
        std::stringstream sout;
        sout << "setting input material ids ";
        for(it=materialids.begin(); it!= materialids.end(); it++)
        {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    if(!fMesh)
    {
        LOGPZ_ERROR(logger,"SetMaterialIds called without mesh")
        return;
    }
    int64_t iel;
    TPZAdmChunkVector<TPZCompEl*> &elvec = fMesh->ElementVec();
    int64_t nel = elvec.NElements();
    for(iel=0; iel<nel; iel++)
    {
        TPZCompEl *cel = elvec[iel];
        if(!cel) continue;
        TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (cel);
        if(!subcmesh) continue;
        TPZAutoPointer<TPZLinearAnalysis> analysis = subcmesh->Analysis();
        if(!analysis)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without analysis object")
            DebugStop();
        }
        TPZStructMatrix *str = analysis->StructMatrix().operator->();
        if(!str)
        {
            LOGPZ_ERROR(logger,"SetMaterialIds called for substructure without structural matrix")
            continue;
        }
        str->SetMaterialIds(materialids);
    }
}